

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_hashtable.cpp
# Opt level: O2

shared_ptr<duckdb::ArenaAllocator,_true> __thiscall
duckdb::GroupedAggregateHashTable::GetAggregateAllocator(GroupedAggregateHashTable *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  shared_ptr<duckdb::ArenaAllocator,_true> sVar1;
  
  ::std::__shared_ptr<duckdb::ArenaAllocator,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<duckdb::ArenaAllocator,_(__gnu_cxx::_Lock_policy)2> *)this,
             (__shared_ptr<duckdb::ArenaAllocator,_(__gnu_cxx::_Lock_policy)2> *)(in_RSI + 0xf8));
  sVar1.internal.super___shared_ptr<duckdb::ArenaAllocator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  sVar1.internal.super___shared_ptr<duckdb::ArenaAllocator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<duckdb::ArenaAllocator,_true>)
         sVar1.internal.super___shared_ptr<duckdb::ArenaAllocator,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<ArenaAllocator> GroupedAggregateHashTable::GetAggregateAllocator() {
	return aggregate_allocator;
}